

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.hpp
# Opt level: O2

void __thiscall
toml::basic_value<toml::type_config>::basic_value
          (basic_value<toml::type_config> *this,basic_value<toml::type_config> *v)

{
  anon_union_64_11_c2653db1_for_basic_value<toml::type_config>_2 *this_00;
  pointer pbVar1;
  value_type_conflict4 vVar2;
  size_type sVar3;
  undefined8 uVar4;
  uint8_t uVar5;
  
  this->type_ = v->type_;
  detail::region::region(&this->region_,&v->region_);
  pbVar1 = (v->comments_).comments.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  (this->comments_).comments.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (v->comments_).comments.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->comments_).comments.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = pbVar1;
  (this->comments_).comments.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (v->comments_).comments.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (v->comments_).comments.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (v->comments_).comments.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (v->comments_).comments.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = &this->field_1;
  switch(this->type_) {
  case boolean:
    (this_00->offset_datetime_).value.date.year = (int16_t)(v->field_1).boolean_;
    break;
  case integer:
    detail::value_with_format<long,_toml::integer_format_info>::value_with_format
              ((value_with_format<long,_toml::integer_format_info> *)&this_00->boolean_,
               (value_with_format<long,_toml::integer_format_info> *)&(v->field_1).boolean_);
    return;
  case floating:
    detail::value_with_format<double,_toml::floating_format_info>::value_with_format
              ((value_with_format<double,_toml::floating_format_info> *)&this_00->boolean_,
               (value_with_format<double,_toml::floating_format_info> *)&(v->field_1).boolean_);
    return;
  case string:
    detail::
    value_with_format<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::string_format_info>
    ::value_with_format((value_with_format<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::string_format_info>
                         *)&this_00->boolean_,
                        (value_with_format<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::string_format_info>
                         *)&(v->field_1).boolean_);
    return;
  case offset_datetime:
  case local_datetime:
  case local_time:
    vVar2 = (v->field_1).integer_.value;
    sVar3 = (v->field_1).string_.value._M_string_length;
    uVar4 = *(undefined8 *)((long)&(v->field_1).string_.value.field_2 + 8);
    (this->field_1).string_.value.field_2._M_allocated_capacity =
         (v->field_1).string_.value.field_2._M_allocated_capacity;
    *(undefined8 *)((long)&(this->field_1).string_.value.field_2 + 8) = uVar4;
    (this_00->integer_).value = vVar2;
    (this->field_1).string_.value._M_string_length = sVar3;
    break;
  case local_date:
    uVar5 = *(uint8_t *)((long)&v->field_1 + 5);
    *(uint8_t *)((long)&this->field_1 + 4) = *(uint8_t *)((long)&v->field_1 + 4);
    *(uint8_t *)((long)&this->field_1 + 5) = uVar5;
    (this_00->offset_datetime_).value.date = (v->field_1).offset_datetime_.value.date;
    break;
  case array:
    (this->field_1).integer_.value = (v->field_1).integer_.value;
    (v->field_1).integer_.value = 0;
    *(undefined4 *)((long)&this->field_1 + 0x10) = *(undefined4 *)((long)&v->field_1 + 0x10);
    (this->field_1).string_.value._M_string_length = (v->field_1).string_.value._M_string_length;
    break;
  case table:
    (this->field_1).integer_.value = (v->field_1).integer_.value;
    (v->field_1).integer_.value = 0;
    sVar3 = (v->field_1).string_.value.field_2._M_allocated_capacity;
    (this->field_1).string_.value._M_string_length = (v->field_1).string_.value._M_string_length;
    (this->field_1).string_.value.field_2._M_allocated_capacity = sVar3;
    break;
  default:
    (this_00->boolean_).value = false;
  }
  return;
}

Assistant:

basic_value(basic_value&& v)
        : type_(v.type()), region_(std::move(v.region_)),
          comments_(std::move(v.comments_))
    {
        switch(this->type_)
        {
            case value_t::boolean        : assigner(boolean_        , std::move(v.boolean_        )); break;
            case value_t::integer        : assigner(integer_        , std::move(v.integer_        )); break;
            case value_t::floating       : assigner(floating_       , std::move(v.floating_       )); break;
            case value_t::string         : assigner(string_         , std::move(v.string_         )); break;
            case value_t::offset_datetime: assigner(offset_datetime_, std::move(v.offset_datetime_)); break;
            case value_t::local_datetime : assigner(local_datetime_ , std::move(v.local_datetime_ )); break;
            case value_t::local_date     : assigner(local_date_     , std::move(v.local_date_     )); break;
            case value_t::local_time     : assigner(local_time_     , std::move(v.local_time_     )); break;
            case value_t::array          : assigner(array_          , std::move(v.array_          )); break;
            case value_t::table          : assigner(table_          , std::move(v.table_          )); break;
            default                      : assigner(empty_          , '\0'                         ); break;
        }
    }